

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O1

void satoko_bookmark(satoko_t *s)

{
  if (s->status != 1) {
    __assert_fail("s->status == SATOKO_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                  ,0x1be,"void satoko_bookmark(satoko_t *)");
  }
  if (s->trail_lim->size == 0) {
    s->book_cl_orig = s->originals->size;
    s->book_cl_lrnt = s->learnts->size;
    s->book_vars = s->assigns->size;
    s->book_trail = s->trail->size;
    (s->opts).no_simplify = '\x01';
    return;
  }
  __assert_fail("solver_dlevel(s) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver_api.c"
                ,0x1bf,"void satoko_bookmark(satoko_t *)");
}

Assistant:

void satoko_bookmark(satoko_t *s)
{
    // printf("[Satoko] Bookmark.\n");
    assert(s->status == SATOKO_OK);
    assert(solver_dlevel(s) == 0);
    s->book_cl_orig = vec_uint_size(s->originals);
    s->book_cl_lrnt = vec_uint_size(s->learnts);
    s->book_vars = vec_char_size(s->assigns);
    s->book_trail = vec_uint_size(s->trail);
    // s->book_qhead = s->i_qhead;
    s->opts.no_simplify = 1;
}